

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::filter::operator()
          (void *this,size_t level,
          array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *path)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  string_view input;
  string_view pattern;
  
  lVar3 = *this;
  uVar6 = level + 1;
  uVar2 = *(long *)((long)this + 8) - lVar3 >> 4;
  if (uVar6 <= uVar2) {
    uVar2 = uVar6;
  }
  if (uVar2 == 0) {
    bVar1 = true;
  }
  else {
    uVar5 = 1;
    uVar2 = 0;
    do {
      input._M_str = path->_M_elems[uVar2]._M_str;
      input._M_len = path->_M_elems[uVar2]._M_len;
      pattern._M_str = *(char **)(lVar3 + 8 + uVar2 * 0x10);
      pattern._M_len = *(size_t *)(lVar3 + uVar2 * 0x10);
      bVar1 = utility::is_match(input,pattern);
      if (!bVar1) {
        return bVar1;
      }
      lVar3 = *this;
      uVar2 = (ulong)uVar5;
      uVar4 = *(long *)((long)this + 8) - lVar3 >> 4;
      if (uVar6 <= uVar4) {
        uVar4 = uVar6;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 < uVar4);
  }
  return bVar1;
}

Assistant:

constexpr auto operator()(const std::size_t level,
                                const TPath& path) const -> bool {
        for (auto i = 0u; i < math::min_value(level + 1, std::size(path_));
             ++i) {
          if (not utility::is_match(path[i], path_[i])) {
            return false;
          }
        }
        return true;
      }